

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmap.h
# Opt level: O2

QSettingsIniSection * __thiscall
QMap<QString,_QSettingsIniSection>::operator[]
          (QMap<QString,_QSettingsIniSection> *this,QString *key)

{
  QMapData<std::map<QString,_QSettingsIniSection,_std::less<QString>,_std::allocator<std::pair<const_QString,_QSettingsIniSection>_>_>_>
  *pQVar1;
  iterator iVar2;
  long in_FS_OFFSET;
  pair<std::_Rb_tree_iterator<std::pair<const_QString,_QSettingsIniSection>_>,_bool> pVar3;
  QSettingsIniSection local_68;
  pair<const_QString,_QSettingsIniSection> local_58;
  QExplicitlySharedDataPointerV2<QMapData<std::map<QString,_QSettingsIniSection,_std::less<QString>,_std::allocator<std::pair<const_QString,_QSettingsIniSection>_>_>_>_>
  local_30;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  local_30.d.ptr =
       (totally_ordered_wrapper<QMapData<std::map<QString,_QSettingsIniSection,_std::less<QString>,_std::allocator<std::pair<const_QString,_QSettingsIniSection>_>_>_>_*>
        )(this->d).d.ptr;
  if ((local_30.d.ptr ==
       (QMapData<std::map<QString,_QSettingsIniSection,_std::less<QString>,_std::allocator<std::pair<const_QString,_QSettingsIniSection>_>_>_>
        *)0x0) ||
     ((__atomic_base<int>)
      *(__int_type_conflict *)
       &(((QMapData<std::map<QString,_QSettingsIniSection,_std::less<QString>,_std::allocator<std::pair<const_QString,_QSettingsIniSection>_>_>_>
           *)local_30.d.ptr)->super_QSharedData).ref.super_QAtomicInteger<int>.
        super_QBasicAtomicInteger<int>._q_value == (__atomic_base<int>)0x1)) {
    local_30.d.ptr =
         (totally_ordered_wrapper<QMapData<std::map<QString,_QSettingsIniSection,_std::less<QString>,_std::allocator<std::pair<const_QString,_QSettingsIniSection>_>_>_>_*>
          )(QMapData<std::map<QString,_QSettingsIniSection,_std::less<QString>,_std::allocator<std::pair<const_QString,_QSettingsIniSection>_>_>_>
            *)0x0;
  }
  else {
    LOCK();
    (((QMapData<std::map<QString,_QSettingsIniSection,_std::less<QString>,_std::allocator<std::pair<const_QString,_QSettingsIniSection>_>_>_>
       *)local_30.d.ptr)->super_QSharedData).ref.super_QAtomicInteger<int>.
    super_QBasicAtomicInteger<int>._q_value =
         (Type)((int)(((QMapData<std::map<QString,_QSettingsIniSection,_std::less<QString>,_std::allocator<std::pair<const_QString,_QSettingsIniSection>_>_>_>
                        *)local_30.d.ptr)->super_QSharedData).ref.super_QAtomicInteger<int>.
                     super_QBasicAtomicInteger<int>._q_value + 1);
    UNLOCK();
  }
  detach(this);
  iVar2 = std::
          _Rb_tree<QString,_std::pair<const_QString,_QSettingsIniSection>,_std::_Select1st<std::pair<const_QString,_QSettingsIniSection>_>,_std::less<QString>,_std::allocator<std::pair<const_QString,_QSettingsIniSection>_>_>
          ::find(&(((this->d).d.ptr)->m)._M_t,key);
  pQVar1 = (this->d).d.ptr;
  if ((_Rb_tree_header *)iVar2._M_node == &(pQVar1->m)._M_t._M_impl.super__Rb_tree_header) {
    local_68.position = -1;
    local_68.keyMap.d.d.ptr =
         (QExplicitlySharedDataPointerV2<QMapData<std::map<QSettingsIniKey,_QVariant,_std::less<QSettingsIniKey>,_std::allocator<std::pair<const_QSettingsIniKey,_QVariant>_>_>_>_>
          )(totally_ordered_wrapper<QMapData<std::map<QSettingsIniKey,_QVariant,_std::less<QSettingsIniKey>,_std::allocator<std::pair<const_QSettingsIniKey,_QVariant>_>_>_>_*>
            )0x0;
    std::pair<const_QString,_QSettingsIniSection>::pair<QSettingsIniSection,_true>
              (&local_58,key,&local_68);
    pVar3 = std::
            _Rb_tree<QString,std::pair<QString_const,QSettingsIniSection>,std::_Select1st<std::pair<QString_const,QSettingsIniSection>>,std::less<QString>,std::allocator<std::pair<QString_const,QSettingsIniSection>>>
            ::_M_insert_unique<std::pair<QString_const,QSettingsIniSection>>
                      ((_Rb_tree<QString,std::pair<QString_const,QSettingsIniSection>,std::_Select1st<std::pair<QString_const,QSettingsIniSection>>,std::less<QString>,std::allocator<std::pair<QString_const,QSettingsIniSection>>>
                        *)&pQVar1->m,&local_58);
    iVar2._M_node = (_Base_ptr)pVar3.first._M_node;
    std::pair<const_QString,_QSettingsIniSection>::~pair(&local_58);
    QtPrivate::
    QExplicitlySharedDataPointerV2<QMapData<std::map<QSettingsIniKey,_QVariant,_std::less<QSettingsIniKey>,_std::allocator<std::pair<const_QSettingsIniKey,_QVariant>_>_>_>_>
    ::~QExplicitlySharedDataPointerV2(&local_68.keyMap.d);
  }
  QtPrivate::
  QExplicitlySharedDataPointerV2<QMapData<std::map<QString,_QSettingsIniSection,_std::less<QString>,_std::allocator<std::pair<const_QString,_QSettingsIniSection>_>_>_>_>
  ::~QExplicitlySharedDataPointerV2(&local_30);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return (QSettingsIniSection *)&iVar2._M_node[1]._M_right;
  }
  __stack_chk_fail();
}

Assistant:

T &operator[](const Key &key)
    {
        const auto copy = d.isShared() ? *this : QMap(); // keep `key` alive across the detach
        detach();
        auto i = d->m.find(key);
        if (i == d->m.end())
            i = d->m.insert({key, T()}).first;
        return i->second;
    }